

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonObject.cpp
# Opt level: O2

JsonString * __thiscall json::JsonObject::setString(JsonObject *this,string *name,string *value)

{
  __uniq_ptr_data<json::JsonNode,_std::default_delete<json::JsonNode>,_true,_true> this_00;
  JsonString *pJVar1;
  mapped_type *this_01;
  Value local_30;
  
  this_00.super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>._M_t.
  super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
  super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl =
       (__uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>)operator_new(0x30);
  JsonString::JsonString
            ((JsonString *)
             this_00.super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>.
             _M_t.super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
             super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl,&this->super_JsonNode,value
            );
  pJVar1 = JsonNode::operator_cast_to_JsonString_
                     ((JsonNode *)
                      this_00.
                      super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>
                      .super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl);
  local_30.orderIndex = this->childCounter;
  this->childCounter = local_30.orderIndex + 1;
  local_30.node._M_t.super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>.
  _M_t.super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
  super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl =
       (__uniq_ptr_data<json::JsonNode,_std::default_delete<json::JsonNode>,_true,_true>)
       (__uniq_ptr_data<json::JsonNode,_std::default_delete<json::JsonNode>,_true,_true>)
       this_00.super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>._M_t.
       super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
       super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl;
  this_01 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->children,name);
  Value::operator=(this_01,&local_30);
  if ((_Head_base<0UL,_json::JsonNode_*,_false>)
      local_30.node._M_t.super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>
      ._M_t.super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
      super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl !=
      (_Head_base<0UL,_json::JsonNode_*,_false>)0x0) {
    (*((JsonNode *)
      local_30.node._M_t.super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>
      ._M_t.super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
      super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl)->_vptr_JsonNode[1])();
  }
  return pJVar1;
}

Assistant:

JsonString &JsonObject::setString(const std::string &name, std::string &&value)
    {
        std::unique_ptr<JsonNode> child(new JsonString(this, std::move(value)));
        JsonString &ref = *child;
        children[name] = {std::move(child), childCounter++};
        return ref;
    }